

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.h
# Opt level: O2

void __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::SplitBranchNode
          (SplitBranchNode *this,char16_t middleUnit,Node *lessThanNode,Node *greaterOrEqualNode)

{
  int iVar1;
  int32_t iVar2;
  
  iVar1 = 0;
  iVar2 = 0;
  if (lessThanNode != (Node *)0x0) {
    iVar2 = lessThanNode->hash;
  }
  if (greaterOrEqualNode != (Node *)0x0) {
    iVar1 = greaterOrEqualNode->hash;
  }
  (this->super_BranchNode).super_Node.hash =
       iVar1 + ((uint)(ushort)middleUnit * 0x25 + iVar2) * 0x25 + -0xbaaec9f;
  (this->super_BranchNode).super_Node.offset = 0;
  (this->super_BranchNode).super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UObject_003b5980;
  *(char16_t *)&(this->super_BranchNode).field_0x14 = middleUnit;
  this->lessThan = lessThanNode;
  this->greaterOrEqual = greaterOrEqualNode;
  return;
}

Assistant:

SplitBranchNode(char16_t middleUnit, Node *lessThanNode, Node *greaterOrEqualNode)
                : BranchNode(((0x555555u*37u+middleUnit)*37u+
                              hashCode(lessThanNode))*37u+hashCode(greaterOrEqualNode)),
                  unit(middleUnit), lessThan(lessThanNode), greaterOrEqual(greaterOrEqualNode) {}